

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,unsigned_long,fmt::v8::detail::digit_grouping<char32_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,unsigned_long significand,
          int significand_size,int integral_size,char32_t decimal_point,
          digit_grouping<char32_t> *grouping)

{
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar1;
  char32_t *pcVar2;
  ulong uVar3;
  unsigned_long uVar4;
  char32_t *pcVar5;
  char32_t *pcVar6;
  uint uVar7;
  int iVar8;
  basic_string_view<char32_t> digits;
  format_decimal_result<char32_t_*> fVar9;
  char32_t cStack_888;
  char32_t acStack_884 [23];
  undefined8 local_828;
  undefined1 *local_820;
  long lStack_818;
  long local_810;
  undefined1 local_808 [2008];
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    if (decimal_point == L'\0') {
      fVar9 = format_decimal<char32_t,unsigned_long>
                        ((char32_t *)&local_828,significand,significand_size);
      pcVar2 = fVar9.end;
    }
    else {
      pcVar2 = (char32_t *)((long)&local_828 + (long)significand_size * 4 + 4);
      uVar7 = significand_size - integral_size;
      pcVar6 = pcVar2;
      if (1 < (int)uVar7) {
        iVar8 = (uVar7 >> 1) + 1;
        uVar4 = significand;
        pcVar5 = pcVar2;
        do {
          pcVar6 = pcVar5 + -2;
          significand = uVar4 / 100;
          pcVar5[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                            [(uVar4 % 100) * 2];
          pcVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                            [(uVar4 % 100) * 2 + 1];
          iVar8 = iVar8 + -1;
          uVar4 = significand;
          pcVar5 = pcVar6;
        } while (1 < iVar8);
      }
      uVar3 = significand;
      if ((uVar7 & 1) != 0) {
        uVar3 = significand / 10;
        pcVar6[-1] = (int)significand + (int)uVar3 * -10 | 0x30;
        pcVar6 = pcVar6 + -1;
      }
      pcVar6[-1] = decimal_point;
      format_decimal<char32_t,unsigned_long>
                (pcVar6 + (-1 - (long)integral_size),uVar3,integral_size);
    }
    bVar1 = copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                      ((char32_t *)&local_828,pcVar2,out);
  }
  else {
    local_820 = local_808;
    lStack_818 = 0;
    local_828 = &PTR_grow_001b2970;
    local_810 = 500;
    if (decimal_point == L'\0') {
      fVar9 = format_decimal<char32_t,unsigned_long>(&cStack_888,significand,significand_size);
      pcVar2 = fVar9.end;
    }
    else {
      pcVar2 = acStack_884 + significand_size;
      uVar7 = significand_size - integral_size;
      pcVar6 = pcVar2;
      if (1 < (int)uVar7) {
        iVar8 = (uVar7 >> 1) + 1;
        uVar4 = significand;
        pcVar5 = pcVar2;
        do {
          pcVar6 = pcVar5 + -2;
          significand = uVar4 / 100;
          pcVar5[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                            [(uVar4 % 100) * 2];
          pcVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                            [(uVar4 % 100) * 2 + 1];
          iVar8 = iVar8 + -1;
          uVar4 = significand;
          pcVar5 = pcVar6;
        } while (1 < iVar8);
      }
      uVar3 = significand;
      if ((uVar7 & 1) != 0) {
        uVar3 = significand / 10;
        pcVar6[-1] = (int)significand + (int)uVar3 * -10 | 0x30;
        pcVar6 = pcVar6 + -1;
      }
      pcVar6[-1] = decimal_point;
      format_decimal<char32_t,unsigned_long>
                (pcVar6 + (-1 - (long)integral_size),uVar3,integral_size);
    }
    copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
              (&cStack_888,pcVar2,(buffer<char32_t> *)&local_828);
    if (integral_size < 0) {
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    }
    digits.size_._0_4_ = integral_size;
    digits.data_ = (char32_t *)local_820;
    digits.size_._4_4_ = 0;
    digit_grouping<char32_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>
              (grouping,out,digits);
    bVar1 = copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                      ((char32_t *)(local_820 + (ulong)(uint)integral_size * 4),
                       (char32_t *)(local_820 + lStack_818 * 4),out);
    if (local_820 != local_808) {
      operator_delete(local_820,local_810 << 2);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}